

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::anon_unknown_160::CompositeReferencesRec
               (uint32_t depth,AssetResolutionResolver *resolver,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_search_paths,Layer *in_layer,PrimSpec *primspec,string *warn,string *err,
               ReferencesCompositionOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Layer *pLVar2;
  undefined1 *puVar3;
  Path *pPVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  PrimSpec *extraout_RDX;
  PrimSpec *extraout_RDX_00;
  PrimSpec *extraout_RDX_01;
  PrimSpec *pPVar9;
  PrimSpec *extraout_RDX_02;
  long lVar10;
  Path *pPVar11;
  undefined8 uVar12;
  char *pcVar13;
  _Alloc_hider _Var14;
  PrimSpec *err_00;
  int iVar15;
  Layer *pLVar16;
  bool bVar17;
  ReferencesCompositionOptions *in_stack_ffffffffffffe780;
  string local_1878;
  PrimSpec *src_ps;
  string local_1850;
  string *local_1830;
  Layer *local_1828;
  Layer *local_1820;
  AssetResolutionResolver *local_1818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1810;
  undefined1 *local_1808;
  PrimSpec *local_1800;
  string local_17f8;
  string cwp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  ostringstream ss_e_1;
  long local_1790 [12];
  ios_base local_1730 [264];
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1618;
  undefined1 local_1608 [56];
  LayerMetas local_15d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  local_a8;
  undefined8 local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  void *pvStack_38;
  
  local_1820 = (Layer *)asset_search_paths;
  local_1818 = resolver;
  if (*(uint *)&(err->_M_dataplus)._M_p < depth) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x272);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"Too deep.",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)warn,(ulong)_ss_e_1);
      if (_ss_e_1 != local_1790) {
        operator_delete(_ss_e_1,local_1790[0] + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
    return false;
  }
  pLVar16 = (Layer *)(in_layer->_prim_specs)._M_h._M_rehash_policy._M_next_resize;
  pLVar2 = (Layer *)(in_layer->_prim_specs)._M_h._M_single_bucket;
  bVar17 = pLVar16 == pLVar2;
  err_00 = primspec;
  local_1828 = in_layer;
  if (!bVar17) {
    bVar5 = CompositeReferencesRec
                      (depth + 1,resolver,asset_search_paths,pLVar16,primspec,warn,err,
                       in_stack_ffffffffffffe780);
    if (bVar5) {
      do {
        pLVar16 = (Layer *)((long)&(pLVar16->_metas).timeCodesPerSecond._metas.customData.contained
                           + 0x18);
        bVar17 = pLVar16 == pLVar2;
        if (bVar17) goto LAB_001ab41e;
        err_00 = primspec;
        bVar5 = CompositeReferencesRec
                          (depth + 1,local_1818,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1820,pLVar16,primspec,warn,err,in_stack_ffffffffffffe780);
      } while (bVar5);
    }
    if (!bVar17) {
      return false;
    }
  }
LAB_001ab41e:
  pLVar16 = local_1828;
  cwp._M_dataplus._M_p = (pointer)&cwp.field_2;
  lVar10 = *(long *)((long)&(local_1828->_metas).timeCodesPerSecond._metas.comment.contained + 0x18)
  ;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&cwp,lVar10,
             *(long *)((long)&(local_1828->_metas).timeCodesPerSecond._metas.comment.contained +
                      0x20) + lVar10);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&search_paths,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(pLVar16->_metas).timeCodesPerSecond._metas.customData.contained);
  if (*(char *)((long)&(pLVar16->_metas).metersPerUnit._metas.comment.contained + 0x18) != '\x01')
  goto LAB_001ac52b;
  switch(*(undefined4 *)((long)&(pLVar16->_metas).metersPerUnit._metas.comment.contained + 0x20)) {
  case 0:
  case 4:
    puVar3 = *(undefined1 **)
              ((long)&(pLVar16->_metas).metersPerUnit._metas.comment.contained + 0x28);
    local_1808 = *(undefined1 **)&(pLVar16->_metas).metersPerUnit._metas.customData;
    local_1800 = primspec;
    if (puVar3 != local_1808) {
      local_1810 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &err->_M_string_length;
      local_1830 = (string *)&(pLVar16->_name)._M_string_length;
      pPVar11 = (Path *)(puVar3 + 0x40);
      do {
        pPVar9 = local_1800;
        paVar1 = &pPVar11[-1]._variant_part_str.field_2;
        _ss_e = (pointer)&local_1618;
        local_1618._M_local_buf[0] = '\0';
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1608 + 0x30);
        local_1608._8_8_ = 1;
        local_1608._16_8_ = (_Hash_node_base *)0x0;
        local_1608._24_8_ = 0;
        local_1608._32_4_ = 1.0;
        local_1608._40_8_ = 0;
        local_1608._48_8_ = (__node_base_ptr)0x0;
        local_1608._0_8_ = pbVar8;
        LayerMetas::LayerMetas(&local_15d0);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_78._0_1_ = true;
        local_78._1_1_ = true;
        local_78._2_1_ = true;
        local_78._3_1_ = true;
        local_78._4_1_ = true;
        local_78._5_1_ = true;
        local_78._6_1_ = true;
        local_78._7_1_ = true;
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvStack_38 = (void *)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        src_ps = (PrimSpec *)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        if (*(long *)((long)&pPVar11[-1]._variant_part_str.field_2 + 8) == 0) {
          if (((pPVar11->_prim_part)._M_string_length != 0) &&
             (*(pPVar11->_prim_part)._M_dataplus._M_p == '/')) {
            bVar17 = Layer::find_primspec_at(local_1820,pPVar11,&src_ps,warn);
            iVar15 = 1;
            pPVar9 = extraout_RDX_00;
            if (bVar17) goto LAB_001ab622;
            goto LAB_001aba76;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x297);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1850,
                     "Invalid asset path. assetPath is empty and primPath is not absolute path: {}",
                     "");
          Path::full_path_name_abi_cxx11_(&local_17f8,pPVar11);
          fmt::format<std::__cxx11::string>
                    (&local_1878,(fmt *)&local_1850,(string *)&local_17f8,pbVar8);
          poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&ss_e_1,local_1878._M_dataplus._M_p,
                              local_1878._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
            operator_delete(local_1878._M_dataplus._M_p,local_1878.field_2._M_allocated_capacity + 1
                           );
          }
          uVar12 = local_17f8.field_2._M_allocated_capacity;
          _Var14._M_p = local_17f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_17f8._M_dataplus._M_p != &local_17f8.field_2) goto LAB_001ab9ef;
LAB_001ab9f7:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1850._M_dataplus._M_p != &local_1850.field_2) {
            operator_delete(local_1850._M_dataplus._M_p,local_1850.field_2._M_allocated_capacity + 1
                           );
          }
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_1878._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
              operator_delete(local_1878._M_dataplus._M_p,
                              local_1878.field_2._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
          ::std::ios_base::~ios_base(local_1730);
          iVar15 = 1;
        }
        else {
          pbVar8 = local_1810;
          err_00 = (PrimSpec *)paVar1;
          bVar17 = LoadAsset(local_1818,&cwp,&search_paths,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                              *)local_1810,(AssetPath *)paVar1,pPVar11,(Layer *)&ss_e,&src_ps,true,
                             *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                             *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)pPVar9,warn);
          pPVar9 = extraout_RDX;
          if (!bVar17) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2a5);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1850,"Failed to `references` asset `{}`","");
            fmt::format<std::__cxx11::string>
                      (&local_1878,(fmt *)&local_1850,(string *)paVar1,pbVar8);
LAB_001ab9b7:
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&ss_e_1,local_1878._M_dataplus._M_p,
                                local_1878._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            uVar12 = local_1878.field_2._M_allocated_capacity;
            _Var14._M_p = local_1878._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
LAB_001ab9ef:
              operator_delete(_Var14._M_p,uVar12 + 1);
            }
            goto LAB_001ab9f7;
          }
LAB_001ab622:
          pLVar16 = local_1828;
          if (src_ps == (PrimSpec *)0x0) {
            iVar15 = 7;
          }
          else {
            bVar17 = InheritPrimSpec((tinyusdz *)local_1828,src_ps,pPVar9,warn,(string *)err_00);
            if (!bVar17) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2b1);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1850,"Failed to reference layer `{}`","");
              fmt::format<tinyusdz::value::AssetPath>
                        ((string *)&local_1878,&local_1850,(AssetPath *)paVar1);
              goto LAB_001ab9b7;
            }
            if ((pLVar16->_name).field_2._M_allocated_capacity != 0) {
              iVar6 = ::std::__cxx11::string::compare((char *)local_1830);
              iVar15 = 0;
              if (iVar6 != 0) goto LAB_001aba76;
            }
            iVar15 = 0;
            if (((src_ps->_typeName)._M_string_length != 0) &&
               (iVar6 = ::std::__cxx11::string::compare((char *)&src_ps->_typeName), iVar15 = 0,
               iVar6 != 0)) {
              ::std::__cxx11::string::_M_assign(local_1830);
            }
          }
        }
LAB_001aba76:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,
                          CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) +
                          1);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase(&local_a8,(_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        LayerMetas::~LayerMetas(&local_15d0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1608);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_e != &local_1618) {
          operator_delete(_ss_e,CONCAT71(local_1618._M_allocated_capacity._1_7_,
                                         local_1618._M_local_buf[0]) + 1);
        }
        if ((iVar15 != 7) && (iVar15 != 0)) goto LAB_001abb2e;
        pPVar4 = pPVar11 + 1;
        pPVar11 = (Path *)&pPVar11[1]._variant_part_str;
      } while (&pPVar4->_variant_part != (string *)local_1808);
    }
    iVar15 = 6;
LAB_001abb2e:
    bVar17 = iVar15 == 6;
    goto LAB_001ac28b;
  case 1:
    puVar3 = *(undefined1 **)
              ((long)&(pLVar16->_metas).metersPerUnit._metas.comment.contained + 0x28);
    local_1808 = *(undefined1 **)&(pLVar16->_metas).metersPerUnit._metas.customData;
    local_1800 = primspec;
    if (puVar3 != local_1808) {
      local_1810 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &err->_M_string_length;
      local_1830 = (string *)&(pLVar16->_name)._M_string_length;
      pPVar11 = (Path *)(puVar3 + 0x40);
      do {
        pPVar9 = local_1800;
        paVar1 = &pPVar11[-1]._variant_part_str.field_2;
        _ss_e = (pointer)&local_1618;
        local_1618._M_local_buf[0] = '\0';
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1608 + 0x30);
        local_1608._8_8_ = 1;
        local_1608._16_8_ = (_Hash_node_base *)0x0;
        local_1608._24_8_ = 0;
        local_1608._32_4_ = 1.0;
        local_1608._40_8_ = 0;
        local_1608._48_8_ = (__node_base_ptr)0x0;
        local_1608._0_8_ = pbVar8;
        LayerMetas::LayerMetas(&local_15d0);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_78._0_1_ = true;
        local_78._1_1_ = true;
        local_78._2_1_ = true;
        local_78._3_1_ = true;
        local_78._4_1_ = true;
        local_78._5_1_ = true;
        local_78._6_1_ = true;
        local_78._7_1_ = true;
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvStack_38 = (void *)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        src_ps = (PrimSpec *)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        if (*(long *)((long)&pPVar11[-1]._variant_part_str.field_2 + 8) == 0) {
          if (((pPVar11->_prim_part)._M_string_length != 0) &&
             (*(pPVar11->_prim_part)._M_dataplus._M_p == '/')) {
            bVar17 = Layer::find_primspec_at(local_1820,pPVar11,&src_ps,warn);
            iVar15 = 1;
            pPVar9 = extraout_RDX_02;
            if (bVar17) goto LAB_001abd5e;
            goto LAB_001ac1cf;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2d9);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1850,
                     "Invalid asset path. assetPath is empty and primPath is not absolute path: {}",
                     "");
          Path::full_path_name_abi_cxx11_(&local_17f8,pPVar11);
          fmt::format<std::__cxx11::string>
                    (&local_1878,(fmt *)&local_1850,(string *)&local_17f8,pbVar8);
          poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&ss_e_1,local_1878._M_dataplus._M_p,
                              local_1878._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
            operator_delete(local_1878._M_dataplus._M_p,local_1878.field_2._M_allocated_capacity + 1
                           );
          }
          uVar12 = local_17f8.field_2._M_allocated_capacity;
          _Var14._M_p = local_17f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_17f8._M_dataplus._M_p != &local_17f8.field_2) goto LAB_001ac143;
LAB_001ac14b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1850._M_dataplus._M_p != &local_1850.field_2) {
            operator_delete(local_1850._M_dataplus._M_p,local_1850.field_2._M_allocated_capacity + 1
                           );
          }
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_1878._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
              operator_delete(local_1878._M_dataplus._M_p,
                              local_1878.field_2._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
          ::std::ios_base::~ios_base(local_1730);
          iVar15 = 1;
        }
        else {
          pbVar8 = local_1810;
          err_00 = (PrimSpec *)paVar1;
          bVar17 = LoadAsset(local_1818,&cwp,&search_paths,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                              *)local_1810,(AssetPath *)paVar1,pPVar11,(Layer *)&ss_e,&src_ps,true,
                             *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                             *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)pPVar9,warn);
          pPVar9 = extraout_RDX_01;
          if (!bVar17) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2e3);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1850,"Failed to `references` asset `{}`","");
            fmt::format<std::__cxx11::string>
                      (&local_1878,(fmt *)&local_1850,(string *)paVar1,pbVar8);
LAB_001ac10b:
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&ss_e_1,local_1878._M_dataplus._M_p,
                                local_1878._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            uVar12 = local_1878.field_2._M_allocated_capacity;
            _Var14._M_p = local_1878._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
LAB_001ac143:
              operator_delete(_Var14._M_p,uVar12 + 1);
            }
            goto LAB_001ac14b;
          }
LAB_001abd5e:
          pLVar16 = local_1828;
          if (src_ps == (PrimSpec *)0x0) {
            iVar15 = 0x17;
          }
          else {
            bVar17 = OverridePrimSpec((tinyusdz *)local_1828,src_ps,pPVar9,warn,(string *)err_00);
            if (!bVar17) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2ef);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1850,"Failed to reference layer `{}`","");
              fmt::format<tinyusdz::value::AssetPath>
                        ((string *)&local_1878,&local_1850,(AssetPath *)paVar1);
              goto LAB_001ac10b;
            }
            if ((pLVar16->_name).field_2._M_allocated_capacity != 0) {
              iVar6 = ::std::__cxx11::string::compare((char *)local_1830);
              iVar15 = 0;
              if (iVar6 != 0) goto LAB_001ac1cf;
            }
            iVar15 = 0;
            if (((src_ps->_typeName)._M_string_length != 0) &&
               (iVar6 = ::std::__cxx11::string::compare((char *)&src_ps->_typeName), iVar15 = 0,
               iVar6 != 0)) {
              ::std::__cxx11::string::_M_assign(local_1830);
            }
          }
        }
LAB_001ac1cf:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,
                          CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) +
                          1);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase(&local_a8,(_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        LayerMetas::~LayerMetas(&local_15d0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1608);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_e != &local_1618) {
          operator_delete(_ss_e,CONCAT71(local_1618._M_allocated_capacity._1_7_,
                                         local_1618._M_local_buf[0]) + 1);
        }
        if ((iVar15 != 0x17) && (iVar15 != 0)) goto LAB_001ac287;
        pPVar4 = pPVar11 + 1;
        pPVar11 = (Path *)&pPVar11[1]._variant_part_str;
      } while (&pPVar4->_variant_part != (string *)local_1808);
    }
    iVar15 = 0x16;
LAB_001ac287:
    bVar17 = iVar15 == 0x16;
LAB_001ac28b:
    pLVar16 = local_1828;
    if (bVar17) {
switchD_001ab494_default:
      iVar15 = 0;
    }
    goto LAB_001ac522;
  case 2:
    local_1800 = primspec;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x2c3);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar13 = "`add` references are not supported yet.";
    lVar10 = 0x27;
    break;
  case 3:
    local_1800 = primspec;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x2c1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar13 = "`delete` references are not supported yet.";
    lVar10 = 0x2a;
    break;
  case 5:
    local_1800 = primspec;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x2c5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar13 = "`order` references are not supported yet.";
    lVar10 = 0x29;
    break;
  case 6:
    local_1800 = primspec;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x2c7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar13 = "Invalid listedit qualifier to for `references`.";
    lVar10 = 0x2f;
    break;
  default:
    goto switchD_001ab494_default;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,pcVar13,lVar10);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
  if (warn != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)warn,(ulong)_ss_e_1);
    if (_ss_e_1 != local_1790) {
      operator_delete(_ss_e_1,local_1790[0] + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
  iVar15 = 1;
LAB_001ac522:
  if (iVar15 == 0) {
LAB_001ac52b:
    if (*(char *)((long)&(pLVar16->_metas).metersPerUnit._metas.comment.contained + 0x18) == '\x01')
    {
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector
                ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)
                 ((long)&(pLVar16->_metas).metersPerUnit._metas.comment.contained + 0x28));
    }
    *(undefined1 *)((long)&(pLVar16->_metas).metersPerUnit._metas.comment.contained + 0x18) = 0;
    bVar17 = true;
  }
  else {
    bVar17 = false;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&search_paths);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cwp._M_dataplus._M_p != &cwp.field_2) {
    operator_delete(cwp._M_dataplus._M_p,cwp.field_2._M_allocated_capacity + 1);
  }
  return bVar17;
}

Assistant:

bool CompositeReferencesRec(uint32_t depth, AssetResolutionResolver &resolver,
                            const std::vector<std::string> &asset_search_paths,
                            const Layer &in_layer,
                            PrimSpec &primspec /* [inout] */, std::string *warn,
                            std::string *err,
                            const ReferencesCompositionOptions &options) {
  if (depth > options.max_depth) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositeReferencesRec(depth + 1, resolver, asset_search_paths, in_layer, child,
                                warn, err, options)) {
      return false;
    }
  }

  // Use PrimSpec's AssetResolution state.
  std::string cwp = primspec.get_current_working_path();
  std::vector<std::string> search_paths = primspec.get_asset_search_paths();

  if (primspec.metas().references) {
    const ListEditQual &qual = primspec.metas().references.value().first;
    const auto &refecences = primspec.metas().references.value().second;

    if ((qual == ListEditQual::ResetToExplicit) ||
        (qual == ListEditQual::Prepend)) {
      for (const auto &reference : refecences) {
        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (reference.asset_path.GetAssetPath().empty()) {
          if (reference.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(reference.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Invalid asset path. assetPath is empty and "
                            "primPath is not absolute path: {}",
                            reference.prim_path.full_path_name()));
          }
        } else {

          DCOUT("reference.prim_path = " << reference.prim_path);
          DCOUT("primspec.cwp = " << cwp);
          DCOUT("primspec.search_paths = " << search_paths);
          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         reference.asset_path, reference.prim_path, &layer,
                         &src_ps, /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Failed to `references` asset `{}`",
                            reference.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `inherits` op
        if (!InheritPrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to reference layer `{}`",
                                            reference.asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }

        DCOUT("inherit done: primspec = " << primspec.name());
      }

    } else if (qual == ListEditQual::Delete) {
      PUSH_ERROR_AND_RETURN("`delete` references are not supported yet.");
    } else if (qual == ListEditQual::Add) {
      PUSH_ERROR_AND_RETURN("`add` references are not supported yet.");
    } else if (qual == ListEditQual::Order) {
      PUSH_ERROR_AND_RETURN("`order` references are not supported yet.");
    } else if (qual == ListEditQual::Invalid) {
      PUSH_ERROR_AND_RETURN("Invalid listedit qualifier to for `references`.");
    } else if (qual == ListEditQual::Append) {
      for (const auto &reference : refecences) {
        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (reference.asset_path.GetAssetPath().empty()) {
          if (reference.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(reference.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Invalid asset path. assetPath is empty and "
                            "primPath is not absolute path: {}",
                            reference.prim_path.full_path_name()));
          }
        } else {
          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         reference.asset_path, reference.prim_path, &layer,
                         &src_ps, /* error_when_no_prims */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Failed to `references` asset `{}`",
                            reference.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `over` op
        if (!OverridePrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to reference layer `{}`",
                                            reference.asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }
      }
    }

  }

  // Remove `references`.
  primspec.metas().references.reset();

  return true;
}